

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basictz.cpp
# Opt level: O0

UBool __thiscall
icu_63::BasicTimeZone::hasEquivalentTransitions
          (BasicTimeZone *this,BasicTimeZone *tz,UDate start,UDate end,UBool ignoreDstAmount,
          UErrorCode *status)

{
  bool bVar1;
  bool bVar2;
  UBool UVar3;
  char cVar4;
  int iVar5;
  int32_t iVar6;
  int32_t iVar7;
  int32_t iVar8;
  int32_t iVar9;
  TimeZoneRule *pTVar10;
  UDate UVar11;
  UDate UVar12;
  UBool inRange2;
  UBool inRange1;
  UBool avail2;
  UBool avail1;
  undefined1 local_98 [8];
  TimeZoneTransition tr2;
  TimeZoneTransition tr1;
  UDate time;
  int32_t dst2;
  int32_t dst1;
  int32_t raw2;
  int32_t raw1;
  UErrorCode *status_local;
  UDate UStack_30;
  UBool ignoreDstAmount_local;
  UDate end_local;
  UDate start_local;
  BasicTimeZone *tz_local;
  BasicTimeZone *this_local;
  
  _raw2 = status;
  status_local._7_1_ = ignoreDstAmount;
  UStack_30 = end;
  end_local = start;
  start_local = (UDate)tz;
  tz_local = this;
  UVar3 = ::U_FAILURE(*status);
  if (UVar3 != '\0') {
    return '\0';
  }
  iVar5 = (*(this->super_TimeZone).super_UObject._vptr_UObject[0xb])(this,start_local);
  if ((char)iVar5 != '\0') {
    return '\x01';
  }
  (*(this->super_TimeZone).super_UObject._vptr_UObject[6])
            (end_local,this,0,&dst1,(long)&time + 4,_raw2);
  UVar3 = ::U_FAILURE(*_raw2);
  if (UVar3 != '\0') {
    return '\0';
  }
  (**(code **)(*(long *)start_local + 0x30))(end_local,start_local,0,&dst2,&time,_raw2);
  UVar3 = ::U_FAILURE(*_raw2);
  if (UVar3 != '\0') {
    return '\0';
  }
  if (status_local._7_1_ == '\0') {
    if ((dst1 != dst2) || (time._4_4_ != time._0_4_)) {
      return '\0';
    }
  }
  else if (((dst1 + time._4_4_ != dst2 + time._0_4_) || ((time._4_4_ != 0 && (time._0_4_ == 0)))) ||
          ((time._4_4_ == 0 && (time._0_4_ != 0)))) {
    return '\0';
  }
  tr1.fTo = (TimeZoneRule *)end_local;
  TimeZoneTransition::TimeZoneTransition((TimeZoneTransition *)&tr2.fTo);
  TimeZoneTransition::TimeZoneTransition((TimeZoneTransition *)local_98);
  do {
    iVar5 = (*(this->super_TimeZone).super_UObject._vptr_UObject[0xe])(tr1.fTo,this,0,&tr2.fTo);
    cVar4 = (**(code **)(*(long *)start_local + 0x70))(tr1.fTo,start_local,0,local_98);
    if (status_local._7_1_ != '\0') {
      while (((char)iVar5 != '\0' &&
             (UVar11 = TimeZoneTransition::getTime((TimeZoneTransition *)&tr2.fTo),
             UVar11 <= UStack_30))) {
        pTVar10 = TimeZoneTransition::getFrom((TimeZoneTransition *)&tr2.fTo);
        iVar6 = TimeZoneRule::getRawOffset(pTVar10);
        pTVar10 = TimeZoneTransition::getFrom((TimeZoneTransition *)&tr2.fTo);
        iVar7 = TimeZoneRule::getDSTSavings(pTVar10);
        pTVar10 = TimeZoneTransition::getTo((TimeZoneTransition *)&tr2.fTo);
        iVar8 = TimeZoneRule::getRawOffset(pTVar10);
        pTVar10 = TimeZoneTransition::getTo((TimeZoneTransition *)&tr2.fTo);
        iVar9 = TimeZoneRule::getDSTSavings(pTVar10);
        if (iVar6 + iVar7 != iVar8 + iVar9) break;
        pTVar10 = TimeZoneTransition::getFrom((TimeZoneTransition *)&tr2.fTo);
        iVar6 = TimeZoneRule::getDSTSavings(pTVar10);
        if (iVar6 == 0) break;
        pTVar10 = TimeZoneTransition::getTo((TimeZoneTransition *)&tr2.fTo);
        iVar6 = TimeZoneRule::getDSTSavings(pTVar10);
        if (iVar6 == 0) break;
        UVar11 = TimeZoneTransition::getTime((TimeZoneTransition *)&tr2.fTo);
        (*(this->super_TimeZone).super_UObject._vptr_UObject[0xe])(UVar11,this,0,&tr2.fTo);
      }
      do {
        if ((cVar4 == '\0') ||
           (UVar11 = TimeZoneTransition::getTime((TimeZoneTransition *)local_98), UStack_30 < UVar11
           )) break;
        pTVar10 = TimeZoneTransition::getFrom((TimeZoneTransition *)local_98);
        iVar6 = TimeZoneRule::getRawOffset(pTVar10);
        pTVar10 = TimeZoneTransition::getFrom((TimeZoneTransition *)local_98);
        iVar7 = TimeZoneRule::getDSTSavings(pTVar10);
        pTVar10 = TimeZoneTransition::getTo((TimeZoneTransition *)local_98);
        iVar8 = TimeZoneRule::getRawOffset(pTVar10);
        pTVar10 = TimeZoneTransition::getTo((TimeZoneTransition *)local_98);
        iVar9 = TimeZoneRule::getDSTSavings(pTVar10);
        if (iVar6 + iVar7 != iVar8 + iVar9) break;
        pTVar10 = TimeZoneTransition::getFrom((TimeZoneTransition *)local_98);
        iVar6 = TimeZoneRule::getDSTSavings(pTVar10);
        if (iVar6 == 0) break;
        pTVar10 = TimeZoneTransition::getTo((TimeZoneTransition *)local_98);
        iVar6 = TimeZoneRule::getDSTSavings(pTVar10);
        UVar11 = start_local;
        if (iVar6 == 0) break;
        UVar12 = TimeZoneTransition::getTime((TimeZoneTransition *)local_98);
        (**(code **)(*(long *)UVar11 + 0x70))(UVar12,UVar11,0,local_98);
      } while( true );
    }
    bVar1 = false;
    if ((char)iVar5 != '\0') {
      UVar11 = TimeZoneTransition::getTime((TimeZoneTransition *)&tr2.fTo);
      bVar1 = UVar11 <= UStack_30;
    }
    bVar2 = false;
    if (cVar4 != '\0') {
      UVar11 = TimeZoneTransition::getTime((TimeZoneTransition *)local_98);
      bVar2 = UVar11 <= UStack_30;
    }
    if ((!bVar1) && (!bVar2)) {
      this_local._7_1_ = '\x01';
      goto LAB_0020c677;
    }
    if ((!bVar1) || (!bVar2)) {
      this_local._7_1_ = '\0';
      goto LAB_0020c677;
    }
    UVar11 = TimeZoneTransition::getTime((TimeZoneTransition *)&tr2.fTo);
    UVar12 = TimeZoneTransition::getTime((TimeZoneTransition *)local_98);
    if ((UVar11 != UVar12) || (NAN(UVar11) || NAN(UVar12))) {
      this_local._7_1_ = '\0';
      goto LAB_0020c677;
    }
    if (status_local._7_1_ == '\0') {
      pTVar10 = TimeZoneTransition::getTo((TimeZoneTransition *)&tr2.fTo);
      iVar6 = TimeZoneRule::getRawOffset(pTVar10);
      pTVar10 = TimeZoneTransition::getTo((TimeZoneTransition *)local_98);
      iVar7 = TimeZoneRule::getRawOffset(pTVar10);
      if (iVar6 != iVar7) {
LAB_0020c632:
        this_local._7_1_ = '\0';
LAB_0020c677:
        TimeZoneTransition::~TimeZoneTransition((TimeZoneTransition *)local_98);
        TimeZoneTransition::~TimeZoneTransition((TimeZoneTransition *)&tr2.fTo);
        return this_local._7_1_;
      }
      pTVar10 = TimeZoneTransition::getTo((TimeZoneTransition *)&tr2.fTo);
      iVar6 = TimeZoneRule::getDSTSavings(pTVar10);
      pTVar10 = TimeZoneTransition::getTo((TimeZoneTransition *)local_98);
      iVar7 = TimeZoneRule::getDSTSavings(pTVar10);
      if (iVar6 != iVar7) goto LAB_0020c632;
    }
    else {
      pTVar10 = TimeZoneTransition::getTo((TimeZoneTransition *)&tr2.fTo);
      iVar6 = TimeZoneRule::getRawOffset(pTVar10);
      pTVar10 = TimeZoneTransition::getTo((TimeZoneTransition *)&tr2.fTo);
      iVar7 = TimeZoneRule::getDSTSavings(pTVar10);
      pTVar10 = TimeZoneTransition::getTo((TimeZoneTransition *)local_98);
      iVar8 = TimeZoneRule::getRawOffset(pTVar10);
      pTVar10 = TimeZoneTransition::getTo((TimeZoneTransition *)local_98);
      iVar9 = TimeZoneRule::getDSTSavings(pTVar10);
      if (iVar6 + iVar7 != iVar8 + iVar9) {
LAB_0020c55c:
        this_local._7_1_ = '\0';
        goto LAB_0020c677;
      }
      pTVar10 = TimeZoneTransition::getTo((TimeZoneTransition *)&tr2.fTo);
      iVar6 = TimeZoneRule::getDSTSavings(pTVar10);
      if (iVar6 != 0) {
        pTVar10 = TimeZoneTransition::getTo((TimeZoneTransition *)local_98);
        iVar6 = TimeZoneRule::getDSTSavings(pTVar10);
        if (iVar6 == 0) goto LAB_0020c55c;
      }
      pTVar10 = TimeZoneTransition::getTo((TimeZoneTransition *)&tr2.fTo);
      iVar6 = TimeZoneRule::getDSTSavings(pTVar10);
      if (iVar6 == 0) {
        pTVar10 = TimeZoneTransition::getTo((TimeZoneTransition *)local_98);
        iVar6 = TimeZoneRule::getDSTSavings(pTVar10);
        if (iVar6 != 0) goto LAB_0020c55c;
      }
    }
    tr1.fTo = (TimeZoneRule *)TimeZoneTransition::getTime((TimeZoneTransition *)&tr2.fTo);
  } while( true );
}

Assistant:

UBool
BasicTimeZone::hasEquivalentTransitions(const BasicTimeZone& tz, UDate start, UDate end,
                                        UBool ignoreDstAmount, UErrorCode& status) const {
    if (U_FAILURE(status)) {
        return FALSE;
    }
    if (hasSameRules(tz)) {
        return TRUE;
    }
    // Check the offsets at the start time
    int32_t raw1, raw2, dst1, dst2;
    getOffset(start, FALSE, raw1, dst1, status);
    if (U_FAILURE(status)) {
        return FALSE;
    }
    tz.getOffset(start, FALSE, raw2, dst2, status);
    if (U_FAILURE(status)) {
        return FALSE;
    }
    if (ignoreDstAmount) {
        if ((raw1 + dst1 != raw2 + dst2)
            || (dst1 != 0 && dst2 == 0)
            || (dst1 == 0 && dst2 != 0)) {
            return FALSE;
        }
    } else {
        if (raw1 != raw2 || dst1 != dst2) {
            return FALSE;
        }            
    }
    // Check transitions in the range
    UDate time = start;
    TimeZoneTransition tr1, tr2;
    while (TRUE) {
        UBool avail1 = getNextTransition(time, FALSE, tr1);
        UBool avail2 = tz.getNextTransition(time, FALSE, tr2);

        if (ignoreDstAmount) {
            // Skip a transition which only differ the amount of DST savings
            while (TRUE) {
                if (avail1
                        && tr1.getTime() <= end
                        && (tr1.getFrom()->getRawOffset() + tr1.getFrom()->getDSTSavings()
                                == tr1.getTo()->getRawOffset() + tr1.getTo()->getDSTSavings())
                        && (tr1.getFrom()->getDSTSavings() != 0 && tr1.getTo()->getDSTSavings() != 0)) {
                    getNextTransition(tr1.getTime(), FALSE, tr1);
                } else {
                    break;
                }
            }
            while (TRUE) {
                if (avail2
                        && tr2.getTime() <= end
                        && (tr2.getFrom()->getRawOffset() + tr2.getFrom()->getDSTSavings()
                                == tr2.getTo()->getRawOffset() + tr2.getTo()->getDSTSavings())
                        && (tr2.getFrom()->getDSTSavings() != 0 && tr2.getTo()->getDSTSavings() != 0)) {
                    tz.getNextTransition(tr2.getTime(), FALSE, tr2);
                } else {
                    break;
                }
            }
        }

        UBool inRange1 = (avail1 && tr1.getTime() <= end);
        UBool inRange2 = (avail2 && tr2.getTime() <= end);
        if (!inRange1 && !inRange2) {
            // No more transition in the range
            break;
        }
        if (!inRange1 || !inRange2) {
            return FALSE;
        }
        if (tr1.getTime() != tr2.getTime()) {
            return FALSE;
        }
        if (ignoreDstAmount) {
            if (tr1.getTo()->getRawOffset() + tr1.getTo()->getDSTSavings()
                        != tr2.getTo()->getRawOffset() + tr2.getTo()->getDSTSavings()
                    || (tr1.getTo()->getDSTSavings() != 0 &&  tr2.getTo()->getDSTSavings() == 0)
                    || (tr1.getTo()->getDSTSavings() == 0 &&  tr2.getTo()->getDSTSavings() != 0)) {
                return FALSE;
            }
        } else {
            if (tr1.getTo()->getRawOffset() != tr2.getTo()->getRawOffset() ||
                tr1.getTo()->getDSTSavings() != tr2.getTo()->getDSTSavings()) {
                return FALSE;
            }
        }
        time = tr1.getTime();
    }
    return TRUE;
}